

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB_STL_utils.cpp
# Opt level: O0

void __thiscall
amrex::STLtools::fill
          (STLtools *this,MultiFab *mf,IntVect *nghost,Geometry *geom,Real outside_value,
          Real inside_value)

{
  CoordSys *in_RCX;
  Geometry *in_RDI;
  MultiFab *in_XMM0_Qa;
  MultiFab *in_XMM1_Qa;
  MultiArray4<double> *ma;
  Real other_value;
  Real reference_value;
  XDim3 ptref;
  XDim3 ptmax;
  XDim3 ptmin;
  Triangle *tri_pts;
  GpuArray<double,_3U> dx;
  GpuArray<double,_3U> plo;
  int num_triangles;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffffe68;
  MultiFab *mf_00;
  MultiFab *local_188;
  Array4<double> *local_d8;
  Array4<double> **local_d0;
  MultiFab *local_c0;
  Real local_b8;
  double local_b0;
  double local_a8;
  Real local_a0;
  Real local_98;
  Real local_90;
  undefined8 local_88;
  Real local_80;
  Real local_78;
  Triangle *local_70;
  GpuArray<double,_3U> local_68 [2];
  undefined4 local_34;
  MultiFab *local_30;
  MultiFab *local_28;
  CoordSys *local_20;
  
  local_34 = *(undefined4 *)((in_RDI->super_CoordSys).inv_dx + 2);
  local_30 = in_XMM1_Qa;
  local_28 = in_XMM0_Qa;
  local_20 = in_RCX;
  Geometry::ProbLoArray(in_RDI);
  CoordSys::CellSizeArray(local_68,local_20);
  local_70 = PODVector<amrex::STLtools::Triangle,_std::allocator<amrex::STLtools::Triangle>_>::data
                       ((PODVector<amrex::STLtools::Triangle,_std::allocator<amrex::STLtools::Triangle>_>
                         *)((in_RDI->super_CoordSys).offset + 2));
  local_88 = *(undefined8 *)&(in_RDI->super_CoordSys).ok;
  local_80 = (in_RDI->prob_domain).xlo[0];
  local_78 = (in_RDI->prob_domain).xlo[1];
  local_a0 = (in_RDI->prob_domain).xlo[2];
  local_98 = (in_RDI->prob_domain).xhi[0];
  local_90 = (in_RDI->prob_domain).xhi[1];
  local_b8 = (in_RDI->prob_domain).xhi[2];
  local_b0 = (in_RDI->roundoff_hi_d).arr[0];
  local_a8 = (in_RDI->roundoff_hi_d).arr[1];
  if (((ulong)(in_RDI->roundoff_hi_d).arr[2] & 1) == 0) {
    local_188 = local_30;
  }
  else {
    local_188 = local_28;
  }
  local_c0 = local_188;
  mf_00 = local_28;
  if (((ulong)(in_RDI->roundoff_hi_d).arr[2] & 1) != 0) {
    mf_00 = local_30;
  }
  local_d8 = (Array4<double> *)
             FabArray<amrex::FArrayBox>::arrays<amrex::FArrayBox,_0>(in_stack_fffffffffffffe68);
  local_d0 = &local_d8;
  experimental::
  ParallelFor<amrex::MultiFab,amrex::STLtools::fill(amrex::MultiFab&,amrex::IntVect_const&,amrex::Geometry_const&,double,double)const::__0>
            (mf_00,(IntVect *)in_stack_fffffffffffffe68,(anon_class_160_10_76ce0008 *)0x165b462);
  Gpu::streamSynchronize();
  return;
}

Assistant:

void
STLtools::fill (MultiFab& mf, IntVect const& nghost, Geometry const& geom,
                Real outside_value, Real inside_value) const
{
    int num_triangles = m_num_tri;

    const auto plo = geom.ProbLoArray();
    const auto dx  = geom.CellSizeArray();

    const Triangle* tri_pts = m_tri_pts_d.data();
    XDim3 ptmin = m_ptmin;
    XDim3 ptmax = m_ptmax;
    XDim3 ptref = m_ptref;
    Real reference_value = m_boundry_is_outside ? outside_value :  inside_value;
    Real other_value     = m_boundry_is_outside ?  inside_value : outside_value;

    auto const& ma = mf.arrays();

    ParallelFor(mf, nghost, [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k) noexcept
    {
        Real coords[3];
        coords[0]=plo[0]+i*dx[0];
        coords[1]=plo[1]+j*dx[1];
#if (AMREX_SPACEDIM == 2)
        coords[2]=Real(0.);
#else
        coords[2]=plo[2]+k*dx[2];
#endif
        int num_intersects=0;
        if (coords[0] >= ptmin.x && coords[0] <= ptmax.x &&
            coords[1] >= ptmin.y && coords[1] <= ptmax.y &&
            coords[2] >= ptmin.z && coords[2] <= ptmax.z)
        {
            Real pr[]={ptref.x, ptref.y, ptref.z};
            for (int tr=0; tr < num_triangles; ++tr) {
                if (line_tri_intersects(pr, coords, tri_pts[tr])) {
                    ++num_intersects;
                }
            }
        }
        ma[box_no](i,j,k) = (num_intersects % 2 == 0) ? reference_value : other_value;
    });
    Gpu::streamSynchronize();
}